

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O0

pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *
genPlanePair<float>(pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
                    *__return_storage_ptr__,Matrix<float,_4,_4,_0,_4,_4> *T)

{
  non_const_type local_1c8;
  XprTypeNested local_1c0;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>
  local_1b8;
  undefined1 local_1a8 [8];
  Matrix<float,_4,_1,_0,_4,_1> Nu;
  Type local_190;
  RealScalar local_154;
  kernel_retval<Eigen::FullPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> local_150;
  undefined1 local_138 [8];
  Matrix<float,_4,_1,_0,_4,_1> Pi;
  Type local_120;
  int local_e4;
  RandomReturnType local_df;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
  local_dc;
  ConstantReturnType local_c0;
  undefined1 local_b8 [8];
  FullPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> lu;
  Matrix<float,_3,_4,_0,_3,_4> nullMatrix;
  Matrix<float,_4,_4,_0,_4,_4> *T_local;
  
  Eigen::Matrix<float,_3,_4,_0,_3,_4>::Matrix
            ((Matrix<float,_3,_4,_0,_3,_4> *)&lu.m_prescribedThreshold);
  Eigen::FullPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::FullPivLU
            ((FullPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_b8);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::Ones(&local_c0,3,4);
  Eigen::Matrix<float,3,4,0,3,4>::operator=
            ((Matrix<float,3,4,0,3,4> *)&lu.m_prescribedThreshold,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_3,_4,_0,_3,_4>_>_>
              *)&local_c0);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::Random(&local_df,3,3);
  local_e4 = 0x28;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,3,3,0,3,3>>>
  ::operator*(&local_dc,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,3,3,0,3,3>>>
               *)&local_df,&local_e4);
  Eigen::DenseBase<Eigen::Matrix<float,3,4,0,3,4>>::topLeftCorner<int,int>
            (&local_120,(DenseBase<Eigen::Matrix<float,3,4,0,3,4>> *)&lu.m_prescribedThreshold,3,3);
  Eigen::Block<Eigen::Matrix<float,3,4,0,3,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,3,4,0,3,4>,_1,_1,false> *)&local_120,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>_>
              *)&local_dc);
  Eigen::FullPivLU<Eigen::Matrix<float,-1,-1,0,-1,-1>>::compute<Eigen::Matrix<float,3,4,0,3,4>>
            ((FullPivLU<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_b8,
             (EigenBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *)&lu.m_prescribedThreshold);
  Eigen::FullPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::kernel
            (&local_150,(FullPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_b8);
  Eigen::Matrix<float,4,1,0,4,1>::
  Matrix<Eigen::ReturnByValue<Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<float,_1,_1,0,_1,_1>>>>>
            ((Matrix<float,4,1,0,4,1> *)local_138,
             (EigenBase<Eigen::ReturnByValue<Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>_>
              *)&local_150);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_190,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_138,3);
  local_154 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                   &local_190);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_138,&local_154);
  local_1c8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)T);
  local_1c0.m_matrix =
       (non_const_type)
       Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>::inverse
                 ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)&local_1c8)
  ;
  local_1b8 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>::
              operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                         *)&local_1c0,(MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_138)
  ;
  Eigen::Matrix<float,4,1,0,4,1>::
  Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
            ((Matrix<float,4,1,0,4,1> *)local_1a8,
             (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
              *)&local_1b8);
  std::make_pair<Eigen::Matrix<float,4,1,0,4,1>&,Eigen::Matrix<float,4,1,0,4,1>&>
            (__return_storage_ptr__,(Matrix<float,_4,_1,_0,_4,_1> *)local_138,
             (Matrix<float,_4,_1,_0,_4,_1> *)local_1a8);
  Eigen::FullPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~FullPivLU
            ((FullPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> 
    genPlanePair(Eigen::Matrix<floatPrec,4,4> T){
    
    Eigen::Matrix<floatPrec, 3, 4> nullMatrix;
    Eigen::FullPivLU<Eigen::Matrix<floatPrec, Eigen::Dynamic, Eigen::Dynamic>> lu;

    // the null space of the matrix built from threee
    // randomly generated 3D points in homogenous coordinates
    nullMatrix = Eigen::Matrix<floatPrec, 3, 4>::Ones(3, 4);
    
    nullMatrix.topLeftCorner(3, 3) =
        Eigen::Matrix<floatPrec, 3, 3>::Random(3, 3) * int(POINTSWITHINCUBE);

    lu.compute(nullMatrix);
    Eigen::Matrix<floatPrec, 4,1> Pi = lu.kernel();
    Pi /= Pi.head(3).norm();

    // requires the pose from the two scans, to compute
    // the coordinates of the plane in RefB
    Eigen::Matrix<floatPrec, 4,1> Nu = T.transpose().inverse() * Pi;

    return std::make_pair(Pi,Nu);
}